

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::TeeBranch::tryRead
          (TeeBranch *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncTee *pAVar1;
  Promise<unsigned_long> PVar2;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  TeeBranch *this_local;
  
  pAVar1 = Own<kj::(anonymous_namespace)::AsyncTee>::operator->
                     ((Own<kj::(anonymous_namespace)::AsyncTee> *)((long)buffer + 8));
  PVar2 = AsyncTee::tryRead((AsyncTee *)this,(BranchId)pAVar1,
                            (void *)(ulong)*(byte *)((long)buffer + 0x18),minBytes,maxBytes);
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    return tee->tryRead(branch, buffer, minBytes, maxBytes);
  }